

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O0

void __thiscall kratos::InstantiationStmt::InstantiationStmt(InstantiationStmt *this)

{
  InstantiationStmt *this_local;
  
  this->_vptr_InstantiationStmt = (_func_int **)&PTR___cxa_pure_virtual_00588f48;
  std::
  map<kratos::Port_*,_kratos::Var_*,_std::less<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Var_*>_>_>
  ::map(&this->port_mapping_);
  std::
  map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  ::map(&this->port_debug_);
  std::
  unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
  ::unordered_set(&this->connection_stmt_);
  return;
}

Assistant:

const std::map<Var *, Stmt *> &port_debug() const { return port_debug_; }